

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_yang.c
# Opt level: O2

LY_ERR parse_action(lysp_yang_ctx *ctx,lysp_node *parent,lysp_node_action **actions)

{
  lysp_node_action *plVar1;
  LY_ERR LVar2;
  lysp_node_action *parent_00;
  lysp_node_action *plVar3;
  char *pcVar4;
  char **ppcVar5;
  lysp_node_action_inout *inout_p;
  ly_ctx *plVar6;
  lysp_ext_instance **exts;
  char *pcVar7;
  ly_stmt lVar8;
  bool bVar9;
  undefined4 uStack_a0;
  ly_stmt kw;
  lysp_ext_instance **local_98;
  char *word;
  size_t word_len;
  ly_stmt local_7c;
  char **local_78;
  lysp_qname **local_70;
  char **local_68;
  uint16_t *local_60;
  lysp_node_action_inout *local_58;
  lysp_node_action_inout *local_50;
  lysp_tpdf **local_48;
  lysp_node_grp **local_40;
  char *buf;
  
  parent_00 = (lysp_node_action *)calloc(1,0x110);
  if (parent_00 == (lysp_node_action *)0x0) {
    if (ctx == (lysp_yang_ctx *)0x0) {
      plVar6 = (ly_ctx *)0x0;
    }
    else {
      plVar6 = (ly_ctx *)
               **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
    }
    LVar2 = LY_EMEM;
    ly_log(plVar6,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","parse_action");
  }
  else {
    plVar1 = *actions;
    if (*actions != (lysp_node_action *)0x0) {
      do {
        plVar3 = plVar1;
        plVar1 = (lysp_node_action *)(plVar3->field_0).node.next;
      } while (plVar1 != (lysp_node_action *)0x0);
      actions = &(plVar3->field_0).field_1.next;
    }
    *actions = parent_00;
    exts = (lysp_ext_instance **)&buf;
    LVar2 = get_argument(ctx,Y_IDENTIF_ARG,(uint16_t *)0x0,&word,(char **)exts,&word_len);
    if (LVar2 == LY_SUCCESS) {
      if (buf == (char *)0x0) {
        if (ctx == (lysp_yang_ctx *)0x0) {
          plVar6 = (ly_ctx *)0x0;
        }
        else {
          plVar6 = (ly_ctx *)
                   **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
        }
        pcVar4 = word;
        if (word_len == 0) {
          pcVar4 = "";
        }
        LVar2 = lydict_insert(plVar6,pcVar4,word_len,&(parent_00->field_0).node.name);
      }
      else {
        if (ctx == (lysp_yang_ctx *)0x0) {
          plVar6 = (ly_ctx *)0x0;
        }
        else {
          plVar6 = (ly_ctx *)
                   **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
        }
        LVar2 = lydict_insert_zc(plVar6,word,&(parent_00->field_0).node.name);
      }
      if (LVar2 == LY_SUCCESS) {
        (parent_00->field_0).node.nodetype = (ushort)(parent != (lysp_node *)0x0) * 0x100 + 0x100;
        (parent_00->field_0).node.parent = parent;
        LVar2 = get_keyword(ctx,&kw,&word,&word_len);
        if (LVar2 == LY_SUCCESS) {
          if (kw == LY_STMT_SYNTAX_SEMICOLON) {
            bVar9 = false;
          }
          else {
            if (kw != LY_STMT_SYNTAX_LEFT_BRACE) {
              if (ctx == (lysp_yang_ctx *)0x0) {
                plVar6 = (ly_ctx *)0x0;
              }
              else {
                plVar6 = (ly_ctx *)
                         **(undefined8 **)
                           (ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
              }
              pcVar4 = lyplg_ext_stmt2str(kw);
              ly_vlog(plVar6,(char *)0x0,LYVE_SYNTAX_YANG,
                      "Invalid keyword \"%s\", expected \";\" or \"{\".",pcVar4);
              return LY_EVALID;
            }
            LVar2 = get_keyword(ctx,&kw,&word,&word_len);
            if (LVar2 != LY_SUCCESS) {
              return LVar2;
            }
            bVar9 = kw != LY_STMT_SYNTAX_RIGHT_BRACE;
          }
          local_7c = (uint)(parent == (lysp_node *)0x0) * 8 + LY_STMT_ACTION;
          local_98 = &(parent_00->field_0).node.exts;
          local_40 = &parent_00->groupings;
          local_48 = &parent_00->typedefs;
          local_50 = &parent_00->output;
          local_58 = &parent_00->input;
          local_60 = &(parent_00->field_0).node.flags;
          local_68 = &(parent_00->field_0).node.ref;
          local_70 = &(parent_00->field_0).node.iffeatures;
          local_78 = &(parent_00->field_0).node.dsc;
          lVar8 = kw;
          do {
            if (!bVar9) {
              if ((parent_00->input).field_0.node.nodetype == 0) {
                (parent_00->input).field_0.node.nodetype = 0x1000;
                (parent_00->input).field_0.node.parent = (lysp_node *)parent_00;
                if (ctx == (lysp_yang_ctx *)0x0) {
                  plVar6 = (ly_ctx *)0x0;
                }
                else {
                  plVar6 = (ly_ctx *)
                           **(undefined8 **)
                             (ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
                }
                LVar2 = lydict_insert(plVar6,"input",0,&(parent_00->input).field_0.node.name);
                if (LVar2 != LY_SUCCESS) {
                  return LVar2;
                }
              }
              if ((parent_00->output).field_0.node.nodetype != 0) {
                return LY_SUCCESS;
              }
              (parent_00->output).field_0.node.nodetype = 0x2000;
              (parent_00->output).field_0.node.parent = (lysp_node *)parent_00;
              if (ctx == (lysp_yang_ctx *)0x0) {
                plVar6 = (ly_ctx *)0x0;
              }
              else {
                plVar6 = (ly_ctx *)
                         **(undefined8 **)
                           (ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
              }
              LVar2 = lydict_insert(plVar6,"output",0,&(parent_00->output).field_0.node.name);
              if (LVar2 != LY_SUCCESS) {
                return LVar2 + (LVar2 == LY_SUCCESS);
              }
              return LY_SUCCESS;
            }
            if (lVar8 == LY_STMT_INPUT) {
              lVar8 = LY_STMT_INPUT;
              inout_p = local_58;
LAB_00170327:
              LVar2 = parse_inout(ctx,lVar8,(lysp_node *)parent_00,inout_p);
            }
            else {
              if (lVar8 == LY_STMT_OUTPUT) {
                lVar8 = LY_STMT_OUTPUT;
                inout_p = local_50;
                goto LAB_00170327;
              }
              if (lVar8 == LY_STMT_GROUPING) {
                LVar2 = parse_grouping(ctx,(lysp_node *)parent_00,local_40);
              }
              else if (lVar8 == LY_STMT_TYPEDEF) {
                LVar2 = parse_typedef(ctx,(lysp_node *)parent_00,local_48);
              }
              else if (lVar8 == LY_STMT_EXTENSION_INSTANCE) {
                exts = (lysp_ext_instance **)(ulong)local_7c;
                LVar2 = parse_ext(ctx,word,word_len,parent_00,local_7c,0,local_98);
              }
              else if (lVar8 == LY_STMT_IF_FEATURE) {
                LVar2 = parse_qnames(ctx,LY_STMT_IF_FEATURE,local_70,(yang_arg)local_98,exts);
              }
              else {
                if (lVar8 == LY_STMT_REFERENCE) {
                  pcVar4 = *local_68;
                  lVar8 = LY_STMT_REFERENCE;
                  ppcVar5 = local_68;
                }
                else {
                  if (lVar8 == LY_STMT_STATUS) {
                    LVar2 = parse_status(ctx,local_60,local_98);
                    goto LAB_0017032c;
                  }
                  if (lVar8 != LY_STMT_DESCRIPTION) {
                    if (ctx == (lysp_yang_ctx *)0x0) {
                      plVar6 = (ly_ctx *)0x0;
                    }
                    else {
                      plVar6 = (ly_ctx *)
                               **(undefined8 **)
                                 (ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
                    }
                    pcVar4 = lyplg_ext_stmt2str(lVar8);
                    pcVar7 = "action";
                    if (parent == (lysp_node *)0x0) {
                      pcVar7 = "rpc";
                    }
                    ly_vlog(plVar6,(char *)0x0,LYVE_SYNTAX_YANG,
                            "Invalid keyword \"%s\" as a child of \"%s\".",pcVar4,pcVar7);
                    return LY_EVALID;
                  }
                  pcVar4 = *local_78;
                  lVar8 = LY_STMT_DESCRIPTION;
                  ppcVar5 = local_78;
                }
                exts = (lysp_ext_instance **)0x2;
                LVar2 = parse_text_field(ctx,pcVar4,lVar8,(uint32_t)ppcVar5,(char **)0x2,
                                         Y_IDENTIF_ARG,(uint16_t *)local_98,
                                         (lysp_ext_instance **)CONCAT44(kw,uStack_a0));
              }
            }
LAB_0017032c:
            if (LVar2 != LY_SUCCESS) {
              return LVar2;
            }
            LVar2 = get_keyword(ctx,&kw,&word,&word_len);
            lVar8 = kw;
            if (LVar2 != LY_SUCCESS) {
              return LVar2;
            }
            bVar9 = kw != LY_STMT_SYNTAX_RIGHT_BRACE;
            if (((!bVar9) && (*local_98 != (lysp_ext_instance *)0x0)) &&
               (LVar2 = ly_set_add(&ctx->main_ctx->ext_inst,*local_98,'\x01',(uint32_t *)0x0),
               LVar2 != LY_SUCCESS)) {
              return LVar2;
            }
          } while( true );
        }
      }
    }
  }
  return LVar2;
}

Assistant:

LY_ERR
parse_action(struct lysp_yang_ctx *ctx, struct lysp_node *parent, struct lysp_node_action **actions)
{
    LY_ERR ret = LY_SUCCESS;
    char *buf, *word;
    size_t word_len;
    enum ly_stmt kw;
    struct lysp_node_action *act;

    LY_LIST_NEW_RET(PARSER_CTX(ctx), actions, act, next, LY_EMEM);

    /* get value */
    LY_CHECK_RET(get_argument(ctx, Y_IDENTIF_ARG, NULL, &word, &buf, &word_len));
    INSERT_WORD_GOTO(ctx, buf, act->name, word, word_len, ret, cleanup);
    act->nodetype = parent ? LYS_ACTION : LYS_RPC;
    act->parent = parent;

    YANG_READ_SUBSTMT_FOR_GOTO(ctx, kw, word, word_len, ret, cleanup) {
        switch (kw) {
        case LY_STMT_DESCRIPTION:
            LY_CHECK_RET(parse_text_field(ctx, act->dsc, LY_STMT_DESCRIPTION, 0, &act->dsc, Y_STR_ARG, NULL, &act->exts));
            break;
        case LY_STMT_IF_FEATURE:
            LY_CHECK_RET(parse_qnames(ctx, LY_STMT_IF_FEATURE, &act->iffeatures, Y_STR_ARG, &act->exts));
            break;
        case LY_STMT_REFERENCE:
            LY_CHECK_RET(parse_text_field(ctx, act->ref, LY_STMT_REFERENCE, 0, &act->ref, Y_STR_ARG, NULL, &act->exts));
            break;
        case LY_STMT_STATUS:
            LY_CHECK_RET(parse_status(ctx, &act->flags, &act->exts));
            break;

        case LY_STMT_INPUT:
            LY_CHECK_RET(parse_inout(ctx, kw, (struct lysp_node *)act, &act->input));
            break;
        case LY_STMT_OUTPUT:
            LY_CHECK_RET(parse_inout(ctx, kw, (struct lysp_node *)act, &act->output));
            break;

        case LY_STMT_TYPEDEF:
            LY_CHECK_RET(parse_typedef(ctx, (struct lysp_node *)act, &act->typedefs));
            break;
        case LY_STMT_GROUPING:
            LY_CHECK_RET(parse_grouping(ctx, (struct lysp_node *)act, &act->groupings));
            break;
        case LY_STMT_EXTENSION_INSTANCE:
            LY_CHECK_RET(parse_ext(ctx, word, word_len, act, parent ? LY_STMT_ACTION : LY_STMT_RPC, 0, &act->exts));
            break;
        default:
            LOGVAL_PARSER(ctx, LY_VCODE_INCHILDSTMT, lyplg_ext_stmt2str(kw), parent ? "action" : "rpc");
            return LY_EVALID;
        }
        YANG_READ_SUBSTMT_NEXT_ITER(ctx, kw, word, word_len, act->exts, ret, cleanup);
    }

    /* always initialize inout, they are technically present (needed for later deviations/refines) */
    if (!act->input.nodetype) {
        act->input.nodetype = LYS_INPUT;
        act->input.parent = (struct lysp_node *)act;
        LY_CHECK_RET(lydict_insert(PARSER_CTX(ctx), "input", 0, &act->input.name));
    }
    if (!act->output.nodetype) {
        act->output.nodetype = LYS_OUTPUT;
        act->output.parent = (struct lysp_node *)act;
        LY_CHECK_RET(lydict_insert(PARSER_CTX(ctx), "output", 0, &act->output.name));
    }

cleanup:
    return ret;
}